

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O0

knote * knote_index_RB_MINMAX(knote_index *head,int val)

{
  knote *parent;
  knote *tmp;
  int val_local;
  knote_index *head_local;
  
  tmp = head->rbh_root;
  parent = (knote *)0x0;
  while (tmp != (knote *)0x0) {
    parent = tmp;
    if (val < 0) {
      tmp = (tmp->kn_index).rbe_left;
    }
    else {
      tmp = (tmp->kn_index).rbe_right;
    }
  }
  return parent;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}